

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

fdb_status fdb_get_metaonly(fdb_kvs_handle *handle,fdb_doc *doc)

{
  atomic<unsigned_long> *paVar1;
  fdb_kvs_id_t id;
  size_t __n;
  void *pvVar2;
  docio_handle *handle_00;
  filemgr *file;
  snap_handle *shandle;
  hbtrie *trie;
  btreeblk_handle *handle_01;
  size_t sVar3;
  fdb_status fVar4;
  hbtrie_result hVar5;
  fdb_doc *pfVar6;
  int64_t iVar7;
  long lVar8;
  undefined1 *buf;
  fdb_doc *pfVar9;
  fdb_txn *txn;
  ulong uVar10;
  bool bVar11;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  fdb_doc doc_kv;
  _fdb_key_cmp_info cmp_info;
  undefined1 auStack_78 [8];
  docio_object _doc;
  ulong local_38;
  uint64_t offset;
  
  buf = local_f8;
  auStack_78._0_2_ = 0;
  auStack_78._2_2_ = 0;
  auStack_78._4_4_ = 0;
  _doc.length.keylen = 0;
  _doc.length.metalen = 0;
  _doc.length.bodylen = 0;
  _doc.length.bodylen_ondisk = 0;
  _doc.timestamp = 0;
  _doc._20_4_ = 0;
  _doc.key = (void *)0x0;
  _doc.field_3.seqnum = 0;
  _doc.meta = (void *)0x0;
  if (handle == (fdb_kvs_handle *)0x0) {
    fVar4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    fVar4 = FDB_RESULT_INVALID_ARGS;
    if ((((doc != (fdb_doc *)0x0) && (doc->key != (void *)0x0)) &&
        (0xffffffffffff007f < doc->keylen - 0xff81)) &&
       (((handle->kvs_config).custom_cmp == (fdb_custom_cmp_variable)0x0 ||
        (doc->keylen <= (ulong)((handle->config).blocksize - 0x100))))) {
      pfVar6 = doc;
      pfVar9 = (fdb_doc *)local_f8;
      for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pfVar9->keylen = pfVar6->keylen;
        pfVar6 = (fdb_doc *)&pfVar6->metalen;
        pfVar9 = (fdb_doc *)&pfVar9->metalen;
      }
      LOCK();
      bVar11 = (handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\0';
      if (bVar11) {
        (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\x01';
      }
      UNLOCK();
      fVar4 = FDB_RESULT_HANDLE_BUSY;
      if (bVar11) {
        if (handle->kvs != (kvs_info *)0x0) {
          uVar10 = (ulong)(handle->config).chunksize;
          local_f8 = (undefined1  [8])(doc->keylen + uVar10);
          lVar8 = -(doc->keylen + uVar10 + 0xf & 0xfffffffffffffff0);
          buf = local_f8 + lVar8;
          id = handle->kvs->id;
          doc_kv.size_ondisk = (size_t)buf;
          *(undefined8 *)((long)&uStack_100 + lVar8) = 0x11ec4b;
          kvid2buf(uVar10,id,buf);
          __n = doc->keylen;
          pvVar2 = doc->key;
          *(undefined8 *)((long)&uStack_100 + lVar8) = 0x11ec5d;
          memcpy(buf + uVar10,pvVar2,__n);
        }
        if (handle->shandle == (snap_handle *)0x0) {
          *(undefined8 *)(buf + -8) = 0x11ec8f;
          fdb_check_file_reopen(handle,(file_status_t *)0x0);
          txn = handle->fhandle->root->txn;
          if (txn == (fdb_txn *)0x0) {
            txn = &handle->file->global_txn;
          }
        }
        else {
          txn = handle->shandle->snap_txn;
        }
        doc_kv.deleted = (handle->kvs_config).create_if_missing;
        doc_kv._73_3_ = *(undefined3 *)&(handle->kvs_config).field_0x1;
        doc_kv.flags = *(uint32_t *)&(handle->kvs_config).field_0x4;
        handle_00 = handle->dhandle;
        fVar4 = FDB_RESULT_KEY_NOT_FOUND;
        if ((handle->config).do_not_search_wal == false) {
          file = handle->file;
          shandle = handle->shandle;
          pfVar6 = (fdb_doc *)local_f8;
          if (handle->kvs == (kvs_info *)0x0) {
            pfVar6 = doc;
          }
          *(undefined8 *)(buf + -8) = 0x11ed07;
          fVar4 = wal_find(txn,file,(_fdb_key_cmp_info *)&doc_kv.deleted,shandle,pfVar6,&local_38);
        }
        if (handle->shandle == (snap_handle *)0x0) {
          *(undefined8 *)(buf + -8) = 0x11ed1c;
          fdb_sync_db_header(handle);
        }
        LOCK();
        paVar1 = &handle->op_stats->num_gets;
        (paVar1->super___atomic_base<unsigned_long>)._M_i =
             (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
        UNLOCK();
        if (fVar4 == FDB_RESULT_KEY_NOT_FOUND) {
          *(undefined8 *)(buf + -8) = 0x11ed33;
          _fdb_sync_dirty_root(handle);
          trie = handle->trie;
          pfVar6 = (fdb_doc *)local_f8;
          if (handle->kvs == (kvs_info *)0x0) {
            pfVar6 = doc;
          }
          pvVar2 = pfVar6->key;
          sVar3 = pfVar6->keylen;
          *(undefined8 *)(buf + -8) = 0x11ed52;
          hVar5 = hbtrie_find(trie,pvVar2,(int)sVar3,&local_38);
          handle_01 = handle->bhandle;
          *(undefined8 *)(buf + -8) = 0x11ed5e;
          btreeblk_end(handle_01);
          local_38 = local_38 >> 0x38 | (local_38 & 0xff000000000000) >> 0x28 |
                     (local_38 & 0xff0000000000) >> 0x18 | (local_38 & 0xff00000000) >> 8 |
                     (local_38 & 0xff000000) << 8 | (local_38 & 0xff0000) << 0x18 |
                     (local_38 & 0xff00) << 0x28 | local_38 << 0x38;
          *(undefined8 *)(buf + -8) = 0x11ed73;
          _fdb_release_dirty_root(handle);
          bVar11 = hVar5 == HBTRIE_RESULT_SUCCESS;
        }
        else {
          bVar11 = false;
        }
        uVar10 = local_38;
        if ((fVar4 == FDB_RESULT_SUCCESS && local_38 != 0xffffffffffffffff) || (bVar11)) {
          pfVar6 = (fdb_doc *)local_f8;
          if (handle->kvs == (kvs_info *)0x0) {
            pfVar6 = doc;
          }
          _doc._16_8_ = pfVar6->key;
          auStack_78._0_2_ = (short)pfVar6->keylen;
          _doc.field_3 = (anon_union_8_2_18a01fae_for_docio_object_3)doc->meta;
          bVar11 = (void *)_doc.field_3.seqnum == (void *)0x0;
          _doc.meta = doc->body;
          *(undefined8 *)(buf + -8) = 0x11edeb;
          iVar7 = docio_read_doc_key_meta(handle_00,uVar10,(docio_object *)auStack_78,true);
          if (iVar7 < 1) {
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            if (iVar7 == 0) {
              return FDB_RESULT_KEY_NOT_FOUND;
            }
            return (fdb_status)iVar7;
          }
          if (local_f8 == (undefined1  [8])((ulong)auStack_78 & 0xffff)) {
            doc->seqnum = (fdb_seqnum_t)_doc.key;
            doc->metalen = (ulong)auStack_78 >> 0x10 & 0xffff;
            doc->bodylen = (ulong)auStack_78 >> 0x20;
            doc->meta = (void *)_doc.field_3;
            doc->body = _doc.meta;
            doc->deleted = (bool)((byte)_doc.length.bodylen >> 2 & 1);
            doc->size_ondisk =
                 (ulong)((auStack_78._0_4_ & 0xffff) + ((uint)auStack_78._0_4_ >> 0x10) +
                        _doc.length._0_4_) + 0x20;
            doc->offset = local_38;
            LOCK();
            if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
              (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
            }
            UNLOCK();
            return FDB_RESULT_SUCCESS;
          }
          *(undefined8 *)(buf + -8) = 0x11ee8d;
          free_docio_object((docio_object *)auStack_78,'\0',bVar11,'\0');
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
        }
        else {
          LOCK();
          if ((handle->handle_busy).super___atomic_base<unsigned_char>._M_i == '\x01') {
            (handle->handle_busy).super___atomic_base<unsigned_char>._M_i = '\0';
          }
          UNLOCK();
        }
        fVar4 = FDB_RESULT_KEY_NOT_FOUND;
      }
    }
  }
  return fVar4;
}

Assistant:

LIBFDB_API
fdb_status fdb_get_metaonly(fdb_kvs_handle *handle, fdb_doc *doc)
{
    uint64_t offset;
    struct docio_object _doc;
    struct docio_handle *dhandle;
    struct filemgr *wal_file = NULL;
    fdb_status wr;
    hbtrie_result hr = HBTRIE_RESULT_FAIL;
    fdb_txn *txn;
    struct _fdb_key_cmp_info cmp_info;
    fdb_doc doc_kv;
    LATENCY_STAT_START();

    if (!handle) {
        return FDB_RESULT_INVALID_HANDLE;
    }

    if (!doc || !doc->key ||
        doc->keylen == 0 || doc->keylen > FDB_MAX_KEYLEN ||
        (handle->kvs_config.custom_cmp &&
            doc->keylen > handle->config.blocksize - HBTRIE_HEADROOM)) {
        return FDB_RESULT_INVALID_ARGS;
    }

    doc_kv = *doc;

    if (!atomic_cas_uint8_t(&handle->handle_busy, 0, 1)) {
        return FDB_RESULT_HANDLE_BUSY;
    }

    if (handle->kvs) {
        // multi KV instance mode
        int size_chunk = handle->config.chunksize;
        doc_kv.keylen = doc->keylen + size_chunk;
        doc_kv.key = alca(uint8_t, doc_kv.keylen);
        kvid2buf(size_chunk, handle->kvs->id, doc_kv.key);
        memcpy((uint8_t*)doc_kv.key + size_chunk, doc->key, doc->keylen);
    }

    if (!handle->shandle) {
        fdb_check_file_reopen(handle, NULL);
        txn = handle->fhandle->root->txn;
        if (!txn) {
            txn = &handle->file->global_txn;
        }
    } else {
        txn = handle->shandle->snap_txn;
    }

    cmp_info.kvs_config = handle->kvs_config;
    cmp_info.kvs = handle->kvs;
    wal_file = handle->file;
    dhandle = handle->dhandle;

    if (handle->config.do_not_search_wal) {
        wr = FDB_RESULT_KEY_NOT_FOUND;
    } else {
        if (handle->kvs) {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, &doc_kv,
                          &offset);
        } else {
            wr = wal_find(txn, wal_file, &cmp_info, handle->shandle, doc, &offset);
        }
    }

    if (!handle->shandle) {
        fdb_sync_db_header(handle);
    }
    atomic_incr_uint64_t(&handle->op_stats->num_gets, std::memory_order_relaxed);

    if (wr == FDB_RESULT_KEY_NOT_FOUND) {
        _fdb_sync_dirty_root(handle);

        if (handle->kvs) {
            hr = hbtrie_find(handle->trie, doc_kv.key, doc_kv.keylen,
                             (void *)&offset);
        } else {
            hr = hbtrie_find(handle->trie, doc->key, doc->keylen,
                             (void *)&offset);
        }
        btreeblk_end(handle->bhandle);
        offset = _endian_decode(offset);

        _fdb_release_dirty_root(handle);
    }

    if ((wr == FDB_RESULT_SUCCESS && offset != BLK_NOT_FOUND) ||
         hr == HBTRIE_RESULT_SUCCESS) {
        if (handle->kvs) {
            _doc.key = doc_kv.key;
            _doc.length.keylen = doc_kv.keylen;
        } else {
            _doc.key = doc->key;
            _doc.length.keylen = doc->keylen;
        }
        bool alloced_meta = doc->meta ? false : true;
        _doc.meta = doc->meta;
        _doc.body = doc->body;

        int64_t body_offset = docio_read_doc_key_meta(dhandle, offset, &_doc,
                                                       true);
        if (body_offset <= 0){
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return body_offset < 0 ? (fdb_status)body_offset : FDB_RESULT_KEY_NOT_FOUND;
        }

        if (_doc.length.keylen != doc_kv.keylen) {
            free_docio_object(&_doc, 0, alloced_meta, 0);
            atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
            return FDB_RESULT_KEY_NOT_FOUND;
        }

        doc->seqnum = _doc.seqnum;
        doc->metalen = _doc.length.metalen;
        doc->bodylen = _doc.length.bodylen;
        doc->meta = _doc.meta;
        doc->body = _doc.body;
        doc->deleted = _doc.length.flag & DOCIO_DELETED;
        doc->size_ondisk = _fdb_get_docsize(_doc.length);
        doc->offset = offset;

        LATENCY_STAT_END(handle->file, FDB_LATENCY_GETS);
        atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
        return FDB_RESULT_SUCCESS;
    }

    atomic_cas_uint8_t(&handle->handle_busy, 1, 0);
    return FDB_RESULT_KEY_NOT_FOUND;
}